

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

String * kj::_::convertToReturn<kj::String>
                   (String *__return_storage_ptr__,ExceptionOr<kj::String> *result)

{
  bool bVar1;
  Exception *exception_1;
  
  bVar1 = (result->super_ExceptionOrValue).exception.ptr.isSet;
  if ((result->value).ptr.isSet == true) {
    if (bVar1 != false) {
      throwRecoverableException(&(result->super_ExceptionOrValue).exception.ptr.field_1.value,0);
    }
    (__return_storage_ptr__->content).ptr = (result->value).ptr.field_1.value.content.ptr;
    (__return_storage_ptr__->content).size_ = (result->value).ptr.field_1.value.content.size_;
    (__return_storage_ptr__->content).disposer = (result->value).ptr.field_1.value.content.disposer;
    (result->value).ptr.field_1.value.content.ptr = (char *)0x0;
    (result->value).ptr.field_1.value.content.size_ = 0;
    return __return_storage_ptr__;
  }
  if (bVar1 != false) {
    throwFatalException(&(result->super_ExceptionOrValue).exception.ptr.field_1.value,0);
  }
  unreachable();
}

Assistant:

inline T convertToReturn(ExceptionOr<T>&& result) {
  KJ_IF_SOME(value, result.value) {
    KJ_IF_SOME(exception, result.exception) {
      throwRecoverableException(kj::mv(exception));
    }
    return _::returnMaybeVoid(kj::mv(value));
  } else KJ_IF_SOME(exception, result.exception) {
    throwFatalException(kj::mv(exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }